

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O2

string * __thiscall
cmNewLineStyle::GetCharacters_abi_cxx11_(string *__return_storage_ptr__,cmNewLineStyle *this)

{
  Style SVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  SVar1 = this->NewLineStyle;
  if (SVar1 == CRLF) {
    __s = "\r\n";
    __a = &local_b;
  }
  else if (SVar1 == LF) {
    __s = "\n";
    __a = &local_a;
  }
  else {
    __s = "";
    if (SVar1 == Invalid) {
      __a = &local_9;
    }
    else {
      __a = &local_c;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNewLineStyle::GetCharacters() const
{
  switch (this->NewLineStyle) {
    case Invalid:
      return "";
    case LF:
      return "\n";
    case CRLF:
      return "\r\n";
  }
  return "";
}